

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O2

bool wasm::FunctionUtils::equal(Function *left,Function *right)

{
  char *pcVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  Type TVar5;
  Type TVar6;
  Index index;
  Signature SVar7;
  Type local_30;
  
  if ((left->type).id != (right->type).id) {
    return false;
  }
  sVar3 = Function::getNumVars(left);
  sVar4 = Function::getNumVars(right);
  if (sVar3 == sVar4) {
    SVar7 = HeapType::getSignature(&left->type);
    local_30 = SVar7.params.id;
    sVar3 = wasm::Type::size(&local_30);
    do {
      index = (Index)sVar3;
      sVar4 = Function::getNumLocals(left);
      if (sVar4 <= (sVar3 & 0xffffffff)) {
        pcVar1 = (right->super_Importable).module.super_IString.str._M_str;
        if ((left->super_Importable).module.super_IString.str._M_str != (char *)0x0) {
          return pcVar1 != (char *)0x0;
        }
        if (pcVar1 != (char *)0x0) {
          return false;
        }
        bVar2 = ExpressionAnalyzer::equal(left->body,right->body);
        return bVar2;
      }
      TVar5 = Function::getLocalType(left,index);
      TVar6 = Function::getLocalType(right,index);
      sVar3 = (size_t)(index + 1);
    } while (TVar5.id == TVar6.id);
  }
  return false;
}

Assistant:

bool operator!=(const HeapType& other) const { return id != other.id; }